

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMLSParserImpl::startEntityReference(DOMLSParserImpl *this,XMLEntityDecl *entDecl)

{
  DOMNode *key;
  bool bVar1;
  FilterAction *pFVar2;
  FilterAction local_1c;
  
  if ((((this->super_AbstractDOMParser).fCreateEntityReferenceNodes == true) &&
      (this->fFilter != (DOMLSParserFilter *)0x0)) &&
     (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) {
    bVar1 = ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::containsKey
                      (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode);
    if (bVar1) {
      ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeKey
                (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode);
      applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
    }
  }
  key = (this->super_AbstractDOMParser).fCurrentParent;
  AbstractDOMParser::startEntityReference(&this->super_AbstractDOMParser,entDecl);
  if ((((this->super_AbstractDOMParser).fCreateEntityReferenceNodes == true) &&
      (this->fFilter != (DOMLSParserFilter *)0x0)) &&
     (this->fFilterAction !=
      (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)0x0)
     ) {
    bVar1 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
            containsKey(this->fFilterAction,key);
    if (bVar1) {
      pFVar2 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
               ::get(this->fFilterAction,key,XMLPlatformUtils::fgMemoryManager);
      if (*pFVar2 == FILTER_REJECT) {
        local_1c = FILTER_REJECT;
        ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::put
                  (this->fFilterAction,(this->super_AbstractDOMParser).fCurrentNode,&local_1c);
      }
    }
  }
  return;
}

Assistant:

void DOMLSParserImpl::startEntityReference(const XMLEntityDecl& entDecl)
{
    if(fCreateEntityReferenceNodes && fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    DOMNode* origParent = fCurrentParent;
    AbstractDOMParser::startEntityReference(entDecl);
    if (fCreateEntityReferenceNodes && fFilter)
    {
        if(fFilterAction && fFilterAction->containsKey(origParent) && fFilterAction->get(origParent)==DOMLSParserFilter::FILTER_REJECT)
            fFilterAction->put(fCurrentNode, DOMLSParserFilter::FILTER_REJECT);
    }
}